

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

libcaption_stauts_t sei_to_caption_frame(sei_t *sei,caption_frame_t *frame)

{
  sei_message_t *psVar1;
  libcaption_stauts_t lVar2;
  libcaption_stauts_t lVar3;
  libcaption_stauts_t lVar4;
  sei_message_t **ppsVar5;
  cea708_t cea708;
  
  cea708_init(&cea708,frame->timestamp);
  ppsVar5 = &sei->head;
  lVar4 = LIBCAPTION_OK;
  while( true ) {
    psVar1 = *ppsVar5;
    if (psVar1 == (sei_message_t *)0x0) break;
    if (psVar1->type == sei_type_user_data_registered_itu_t_t35) {
      cea708_parse_h264((uint8_t *)(psVar1 + 1),psVar1->size,&cea708);
      lVar2 = cea708_to_caption_frame(frame,&cea708);
      lVar3 = lVar2;
      if (lVar4 == LIBCAPTION_READY) {
        lVar3 = lVar4;
      }
      if (lVar2 == LIBCAPTION_ERROR) {
        lVar3 = lVar2;
      }
      if (lVar4 != LIBCAPTION_ERROR) {
        lVar4 = lVar3;
      }
    }
    ppsVar5 = &psVar1->next;
  }
  if (lVar4 == LIBCAPTION_READY) {
    frame->timestamp = sei->timestamp;
  }
  return lVar4;
}

Assistant:

libcaption_stauts_t sei_to_caption_frame(sei_t* sei, caption_frame_t* frame)
{
    cea708_t cea708;
    sei_message_t* msg;
    libcaption_stauts_t status = LIBCAPTION_OK;

    cea708_init(&cea708, frame->timestamp);

    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
            cea708_parse_h264(sei_message_data(msg), sei_message_size(msg), &cea708);
            status = libcaption_status_update(status, cea708_to_caption_frame(frame, &cea708));
        }
    }

    if (LIBCAPTION_READY == status) {
        frame->timestamp = sei->timestamp;
    }

    return status;
}